

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void __thiscall GLPortal::ClearClipper(GLPortal *this)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  angle_t aVar5;
  GLWall *pGVar6;
  angle_t a1;
  TAngle<double> local_90;
  undefined1 local_88 [32];
  TVector2<double> local_68;
  DAngle endAngle;
  undefined1 local_50 [32];
  TVector2<double> local_30;
  DAngle startAngle;
  uint i;
  DAngle angleOffset;
  GLPortal *this_local;
  
  angleOffset.Degrees = (double)this;
  deltaangle<double>((TAngle<double> *)&stack0xffffffffffffffe8,&this->savedAngle);
  Clipper::Clear(&clipper);
  Clipper::SafeAddClipRange(&clipper,0,0xffffffff);
  for (startAngle.Degrees._4_4_ = 0; uVar4 = startAngle.Degrees._4_4_,
      uVar3 = TArray<GLWall,_GLWall>::Size(&this->lines), uVar4 < uVar3;
      startAngle.Degrees._4_4_ = startAngle.Degrees._4_4_ + 1) {
    pGVar6 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)startAngle.Degrees._4_4_);
    fVar1 = (pGVar6->glseg).x2;
    pGVar6 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)startAngle.Degrees._4_4_);
    TVector2<double>::TVector2
              ((TVector2<double> *)local_50,(double)fVar1,(double)(pGVar6->glseg).y2);
    operator-((TVector2<double> *)(local_50 + 0x10),(TVector3<double> *)local_50);
    TVector2<double>::Angle(&local_30);
    TAngle<double>::TAngle(&endAngle,(TAngle<double> *)&stack0xffffffffffffffe8);
    TAngle<double>::operator+((TAngle<double> *)&local_30.Y,(TAngle<double> *)&local_30);
    pGVar6 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)startAngle.Degrees._4_4_);
    fVar1 = (pGVar6->glseg).x1;
    pGVar6 = TArray<GLWall,_GLWall>::operator[](&this->lines,(ulong)startAngle.Degrees._4_4_);
    TVector2<double>::TVector2
              ((TVector2<double> *)local_88,(double)fVar1,(double)(pGVar6->glseg).y1);
    operator-((TVector2<double> *)(local_88 + 0x10),(TVector3<double> *)local_88);
    TVector2<double>::Angle(&local_68);
    TAngle<double>::TAngle(&local_90,(TAngle<double> *)&stack0xffffffffffffffe8);
    TAngle<double>::operator+((TAngle<double> *)&local_68.Y,(TAngle<double> *)&local_68);
    deltaangle<double>((TAngle<double> *)&stack0xffffffffffffff68,(TAngle<double> *)&local_68.Y);
    bVar2 = TAngle<double>::operator<((TAngle<double> *)&stack0xffffffffffffff68,0.0);
    if (bVar2) {
      uVar4 = TAngle<double>::BAMs((TAngle<double> *)&local_30.Y);
      uVar3 = TAngle<double>::BAMs((TAngle<double> *)&local_68.Y);
      Clipper::SafeRemoveClipRangeRealAngles(&clipper,uVar4,uVar3);
    }
  }
  aVar5 = FGLRenderer::FrustumAngle(GLRenderer);
  if (aVar5 < 0x80000000) {
    uVar4 = TAngle<double>::BAMs(&ViewAngle);
    uVar3 = TAngle<double>::BAMs(&ViewAngle);
    Clipper::SafeAddClipRangeRealAngles(&clipper,uVar4 + aVar5,uVar3 - aVar5);
  }
  Clipper::SetSilhouette(&clipper);
  return;
}

Assistant:

inline void GLPortal::ClearClipper()
{
	DAngle angleOffset = deltaangle(savedAngle, ViewAngle);

	clipper.Clear();

	static int call=0;

	// Set the clipper to the minimal visible area
	clipper.SafeAddClipRange(0,0xffffffff);
	for (unsigned int i = 0; i < lines.Size(); i++)
	{
		DAngle startAngle = (DVector2(lines[i].glseg.x2, lines[i].glseg.y2) - savedViewPos).Angle() + angleOffset;
		DAngle endAngle = (DVector2(lines[i].glseg.x1, lines[i].glseg.y1) - savedViewPos).Angle() + angleOffset;

		if (deltaangle(endAngle, startAngle) < 0)
		{
			clipper.SafeRemoveClipRangeRealAngles(startAngle.BAMs(), endAngle.BAMs());
		}
	}

	// and finally clip it to the visible area
	angle_t a1 = GLRenderer->FrustumAngle();
	if (a1 < ANGLE_180) clipper.SafeAddClipRangeRealAngles(ViewAngle.BAMs() + a1, ViewAngle.BAMs() - a1);

	// lock the parts that have just been clipped out.
	clipper.SetSilhouette();
}